

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall sglr::GLContext::viewport(GLContext *this,int x,int y,int width,int height)

{
  ostringstream *this_00;
  deUint32 dVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  int iVar4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (this->m_curViewport).m_data[0] = x;
  (this->m_curViewport).m_data[1] = y;
  (this->m_curViewport).m_data[2] = width;
  (this->m_curViewport).m_data[3] = height;
  dVar1 = this->m_drawFramebufferBinding;
  iVar3 = (this->m_baseViewport).m_data[0];
  iVar4 = (this->m_baseViewport).m_data[1];
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"glViewport(",0xb);
    std::ostream::operator<<(this_00,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,height);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,");",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  if (dVar1 != 0) {
    iVar3 = 0;
    iVar4 = 0;
  }
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1a00))(iVar3 + x,iVar4 + y,width,height);
  return;
}

Assistant:

void GLContext::viewport (int x, int y, int width, int height)
{
	m_curViewport = tcu::IVec4(x, y, width, height);
	tcu::IVec2 offset = getDrawOffset();

	// \note For clarity don't add the offset to log
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glViewport(" << x << ", " << y << ", " << width << ", " << height << ");" << TestLog::EndMessage;
	m_context.getFunctions().viewport(x+offset.x(), y+offset.y(), width, height);
}